

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::BVHNIntersector1<4,_257,_true,_embree::avx2::VirtualCurveIntersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  ulong unaff_R15;
  undefined1 auVar20 [64];
  vint4 ai;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vint4 ai_3;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 ai_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vfloat4 a0;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 bi_3;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [16];
  ulong local_10b8;
  ulong local_10b0;
  Intersectors *local_10a8;
  RayQueryContext *local_10a0;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10a0 = context;
  local_10a8 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar26 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar21 = vrsqrtss_avx(auVar26,auVar26);
    auVar35._0_4_ = auVar21._0_4_;
    local_fb8[0] = auVar35._0_4_ * 1.5 -
                   auVar26._0_4_ * 0.5 * auVar35._0_4_ * auVar35._0_4_ * auVar35._0_4_;
    local_fd8 = aVar1.x;
    auVar34._0_4_ = local_fd8 * local_fb8[0];
    auVar34._4_4_ = aVar1.y * local_fb8[0];
    auVar34._8_4_ = aVar1.z * local_fb8[0];
    auVar34._12_4_ = aVar1.field_3.w * local_fb8[0];
    auVar21 = vshufpd_avx(auVar34,auVar34,1);
    auVar26 = vmovshdup_avx(auVar34);
    auVar52._8_4_ = 0x80000000;
    auVar52._0_8_ = 0x8000000080000000;
    auVar52._12_4_ = 0x80000000;
    auVar39._12_4_ = 0;
    auVar39._0_12_ = ZEXT812(0);
    auVar39 = auVar39 << 0x20;
    auVar49 = vunpckhps_avx(auVar34,auVar39);
    auVar35 = vshufps_avx(auVar49,ZEXT416(auVar26._0_4_ ^ 0x80000000),0x41);
    auVar49._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
    auVar49._8_8_ = auVar52._8_8_ ^ auVar21._8_8_;
    auVar49 = vinsertps_avx(auVar49,auVar34,0x2a);
    auVar26 = vdpps_avx(auVar35,auVar35,0x7f);
    auVar21 = vdpps_avx(auVar49,auVar49,0x7f);
    auVar26 = vcmpps_avx(auVar21,auVar26,1);
    auVar53._0_4_ = auVar26._0_4_;
    auVar53._4_4_ = auVar53._0_4_;
    auVar53._8_4_ = auVar53._0_4_;
    auVar53._12_4_ = auVar53._0_4_;
    auVar26 = vblendvps_avx(auVar49,auVar35,auVar53);
    auVar21 = vdpps_avx(auVar26,auVar26,0x7f);
    auVar49 = vrsqrtss_avx(auVar21,auVar21);
    auVar35._0_4_ = auVar49._0_4_;
    auVar35._0_4_ =
         auVar35._0_4_ * 1.5 - auVar21._0_4_ * 0.5 * auVar35._0_4_ * auVar35._0_4_ * auVar35._0_4_;
    auVar45._0_4_ = auVar26._0_4_ * auVar35._0_4_;
    auVar45._4_4_ = auVar26._4_4_ * auVar35._0_4_;
    auVar45._8_4_ = auVar26._8_4_ * auVar35._0_4_;
    auVar45._12_4_ = auVar26._12_4_ * auVar35._0_4_;
    auVar26 = vshufps_avx(auVar45,auVar45,0xc9);
    auVar21 = vshufps_avx(auVar34,auVar34,0xc9);
    auVar54._0_4_ = auVar21._0_4_ * auVar45._0_4_;
    auVar54._4_4_ = auVar21._4_4_ * auVar45._4_4_;
    auVar54._8_4_ = auVar21._8_4_ * auVar45._8_4_;
    auVar54._12_4_ = auVar21._12_4_ * auVar45._12_4_;
    auVar26 = vfmsub231ps_fma(auVar54,auVar34,auVar26);
    auVar49 = vshufps_avx(auVar26,auVar26,0xc9);
    auVar26 = vdpps_avx(auVar49,auVar49,0x7f);
    auVar21 = vrsqrtss_avx(auVar26,auVar26);
    auVar35._0_4_ = auVar21._0_4_;
    auVar35._0_4_ =
         auVar35._0_4_ * 1.5 - auVar35._0_4_ * auVar35._0_4_ * auVar35._0_4_ * auVar26._0_4_ * 0.5;
    auVar21._0_4_ = auVar35._0_4_ * auVar49._0_4_;
    auVar21._4_4_ = auVar35._0_4_ * auVar49._4_4_;
    auVar21._8_4_ = auVar35._0_4_ * auVar49._8_4_;
    auVar21._12_4_ = auVar35._0_4_ * auVar49._12_4_;
    auVar26._0_4_ = local_fb8[0] * auVar34._0_4_;
    auVar26._4_4_ = local_fb8[0] * auVar34._4_4_;
    auVar26._8_4_ = local_fb8[0] * auVar34._8_4_;
    auVar26._12_4_ = local_fb8[0] * auVar34._12_4_;
    auVar49 = vunpcklps_avx(auVar45,auVar26);
    auVar26 = vunpckhps_avx(auVar45,auVar26);
    auVar35 = vunpcklps_avx(auVar21,auVar39);
    auVar21 = vunpckhps_avx(auVar21,auVar39);
    local_f88 = vunpcklps_avx(auVar26,auVar21);
    local_fa8 = vunpcklps_avx(auVar49,auVar35);
    local_f98 = vunpckhps_avx(auVar49,auVar35);
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      auVar49 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar39 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      pauVar14 = (undefined1 (*) [16])local_f68;
      local_fc8._8_4_ = 0x7fffffff;
      local_fc8._0_8_ = 0x7fffffff7fffffff;
      local_fc8._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx((undefined1  [16])aVar1,local_fc8);
      auVar40._8_4_ = 0x219392ef;
      auVar40._0_8_ = 0x219392ef219392ef;
      auVar40._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar40,1);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = &DAT_3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar21 = vdivps_avx(auVar41,(undefined1  [16])aVar1);
      auVar46._8_4_ = 0x5d5e0b6b;
      auVar46._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar46._12_4_ = 0x5d5e0b6b;
      auVar26 = vblendvps_avx(auVar21,auVar46,auVar26);
      auVar42._0_4_ = auVar26._0_4_ * 0.99999964;
      auVar42._4_4_ = auVar26._4_4_ * 0.99999964;
      auVar42._8_4_ = auVar26._8_4_ * 0.99999964;
      auVar42._12_4_ = auVar26._12_4_ * 0.99999964;
      auVar35._0_4_ = auVar26._0_4_ * 1.0000004;
      auVar35._4_4_ = auVar26._4_4_ * 1.0000004;
      auVar35._8_4_ = auVar26._8_4_ * 1.0000004;
      auVar35._12_4_ = auVar26._12_4_ * 1.0000004;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      local_fe8 = vshufps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x55);
      _local_ff8 = vshufps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0xaa);
      local_1018._4_4_ = auVar42._0_4_;
      local_1018._0_4_ = auVar42._0_4_;
      local_1018._8_4_ = auVar42._0_4_;
      local_1018._12_4_ = auVar42._0_4_;
      auVar51 = ZEXT1664(local_1018);
      auVar26 = vmovshdup_avx(auVar42);
      uVar17 = (ulong)(auVar42._0_4_ < 0.0) << 4;
      local_1028 = vshufps_avx(auVar42,auVar42,0x55);
      auVar56 = ZEXT1664(local_1028);
      auVar21 = vshufpd_avx(auVar42,auVar42,1);
      uVar15 = (ulong)(auVar26._0_4_ < 0.0) << 4 | 0x20;
      local_1038 = vshufps_avx(auVar42,auVar42,0xaa);
      auVar57 = ZEXT1664(local_1038);
      local_1058 = vshufps_avx(auVar35,auVar35,0x55);
      auVar61 = ZEXT1664(local_1058);
      local_1068 = vshufps_avx(auVar35,auVar35,0xaa);
      auVar63 = ZEXT1664(local_1068);
      uVar13 = (ulong)(auVar21._0_4_ < 0.0) << 4 | 0x40;
      uVar19 = auVar49._0_4_;
      local_1078._4_4_ = uVar19;
      local_1078._0_4_ = uVar19;
      local_1078._8_4_ = uVar19;
      local_1078._12_4_ = uVar19;
      auVar64 = ZEXT1664(local_1078);
      uVar19 = auVar39._0_4_;
      auVar20 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,uVar19))));
      uVar19 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_1088._4_4_ = uVar19;
      local_1088._0_4_ = uVar19;
      local_1088._8_4_ = uVar19;
      local_1088._12_4_ = uVar19;
      auVar66 = ZEXT1664(local_1088);
      uVar19 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_1098._4_4_ = uVar19;
      local_1098._0_4_ = uVar19;
      local_1098._8_4_ = uVar19;
      local_1098._12_4_ = uVar19;
      auVar68 = ZEXT1664(local_1098);
      uVar19 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      auVar47._4_4_ = uVar19;
      auVar47._0_4_ = uVar19;
      auVar47._8_4_ = uVar19;
      auVar47._12_4_ = uVar19;
      local_10b0 = uVar17;
      local_10b8 = uVar15;
      local_1048 = auVar35._0_4_;
      fStack_1044 = auVar35._0_4_;
      fStack_1040 = auVar35._0_4_;
      fStack_103c = auVar35._0_4_;
      uVar16 = uVar15;
      uVar18 = uVar17;
      fVar58 = auVar35._0_4_;
      fVar59 = auVar35._0_4_;
      fVar60 = auVar35._0_4_;
      do {
        do {
          if (pauVar14 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar8 = pauVar14 + -1;
          pauVar14 = pauVar14 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar8 + 8));
        uVar11 = *(ulong *)*pauVar14;
        do {
          if ((uVar11 & 0xf) == 0) {
            auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar18),auVar66._0_16_);
            auVar22._0_4_ = auVar51._0_4_ * auVar26._0_4_;
            auVar22._4_4_ = auVar51._4_4_ * auVar26._4_4_;
            auVar22._8_4_ = auVar51._8_4_ * auVar26._8_4_;
            auVar22._12_4_ = auVar51._12_4_ * auVar26._12_4_;
            auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar16),auVar68._0_16_);
            auVar27._0_4_ = auVar56._0_4_ * auVar26._0_4_;
            auVar27._4_4_ = auVar56._4_4_ * auVar26._4_4_;
            auVar27._8_4_ = auVar56._8_4_ * auVar26._8_4_;
            auVar27._12_4_ = auVar56._12_4_ * auVar26._12_4_;
            auVar26 = vmaxps_avx(auVar22,auVar27);
            auVar21 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar13),auVar47);
            auVar28._0_4_ = auVar57._0_4_ * auVar21._0_4_;
            auVar28._4_4_ = auVar57._4_4_ * auVar21._4_4_;
            auVar28._8_4_ = auVar57._8_4_ * auVar21._8_4_;
            auVar28._12_4_ = auVar57._12_4_ * auVar21._12_4_;
            auVar21 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar17 ^ 0x10)),
                                 auVar66._0_16_);
            auVar31._0_4_ = auVar35._0_4_ * auVar21._0_4_;
            auVar31._4_4_ = fVar58 * auVar21._4_4_;
            auVar31._8_4_ = fVar59 * auVar21._8_4_;
            auVar31._12_4_ = fVar60 * auVar21._12_4_;
            auVar21 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar15 ^ 0x10)),
                                 auVar68._0_16_);
            auVar36._0_4_ = auVar61._0_4_ * auVar21._0_4_;
            auVar36._4_4_ = auVar61._4_4_ * auVar21._4_4_;
            auVar36._8_4_ = auVar61._8_4_ * auVar21._8_4_;
            auVar36._12_4_ = auVar61._12_4_ * auVar21._12_4_;
            auVar49 = vminps_avx(auVar31,auVar36);
            auVar21 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar13 ^ 0x10)),auVar47);
            auVar37._0_4_ = auVar63._0_4_ * auVar21._0_4_;
            auVar37._4_4_ = auVar63._4_4_ * auVar21._4_4_;
            auVar37._8_4_ = auVar63._8_4_ * auVar21._8_4_;
            auVar37._12_4_ = auVar63._12_4_ * auVar21._12_4_;
            auVar21 = vmaxps_avx(auVar28,auVar64._0_16_);
            local_10c8 = vmaxps_avx(auVar26,auVar21);
            auVar26 = vminps_avx(auVar37,auVar20._0_16_);
            auVar26 = vminps_avx(auVar49,auVar26);
            auVar26 = vcmpps_avx(local_10c8,auVar26,2);
            uVar19 = vmovmskps_avx(auVar26);
LAB_019d82bb:
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar19);
            bVar7 = true;
          }
          else {
            if ((int)(uVar11 & 0xf) == 2) {
              uVar10 = uVar11 & 0xfffffffffffffff0;
              auVar26 = *(undefined1 (*) [16])(uVar10 + 0x80);
              auVar50._0_4_ = (float)local_ff8._0_4_ * auVar26._0_4_;
              auVar50._4_4_ = (float)local_ff8._4_4_ * auVar26._4_4_;
              auVar50._8_4_ = fStack_ff0 * auVar26._8_4_;
              auVar50._12_4_ = fStack_fec * auVar26._12_4_;
              auVar21 = *(undefined1 (*) [16])(uVar10 + 0x90);
              auVar55._0_4_ = (float)local_ff8._0_4_ * auVar21._0_4_;
              auVar55._4_4_ = (float)local_ff8._4_4_ * auVar21._4_4_;
              auVar55._8_4_ = fStack_ff0 * auVar21._8_4_;
              auVar55._12_4_ = fStack_fec * auVar21._12_4_;
              auVar49 = *(undefined1 (*) [16])(uVar10 + 0xa0);
              auVar62._0_4_ = (float)local_ff8._0_4_ * auVar49._0_4_;
              auVar62._4_4_ = (float)local_ff8._4_4_ * auVar49._4_4_;
              auVar62._8_4_ = fStack_ff0 * auVar49._8_4_;
              auVar62._12_4_ = fStack_fec * auVar49._12_4_;
              local_1008 = *(undefined1 (*) [16])(uVar10 + 0x40);
              auVar35 = vfmadd231ps_fma(auVar50,local_fe8,*(undefined1 (*) [16])(uVar10 + 0x50));
              auVar39 = vfmadd231ps_fma(auVar55,local_fe8,*(undefined1 (*) [16])(uVar10 + 0x60));
              auVar34 = vfmadd231ps_fma(auVar62,local_fe8,*(undefined1 (*) [16])(uVar10 + 0x70));
              auVar6._4_4_ = fStack_fd4;
              auVar6._0_4_ = local_fd8;
              auVar6._8_4_ = fStack_fd0;
              auVar6._12_4_ = fStack_fcc;
              auVar45 = vfmadd231ps_fma(auVar35,auVar6,*(undefined1 (*) [16])(uVar10 + 0x20));
              auVar52 = vfmadd231ps_fma(auVar39,auVar6,*(undefined1 (*) [16])(uVar10 + 0x30));
              auVar53 = vfmadd231ps_fma(auVar34,auVar6,local_1008);
              auVar35 = vandps_avx(local_fc8,auVar45);
              auVar67._8_4_ = 0x219392ef;
              auVar67._0_8_ = 0x219392ef219392ef;
              auVar67._12_4_ = 0x219392ef;
              auVar35 = vcmpps_avx(auVar35,auVar67,1);
              auVar39 = vblendvps_avx(auVar45,auVar67,auVar35);
              auVar35 = vandps_avx(auVar52,local_fc8);
              auVar35 = vcmpps_avx(auVar35,auVar67,1);
              auVar34 = vblendvps_avx(auVar52,auVar67,auVar35);
              auVar35 = vandps_avx(auVar53,local_fc8);
              auVar35 = vcmpps_avx(auVar35,auVar67,1);
              auVar35 = vblendvps_avx(auVar53,auVar67,auVar35);
              auVar68 = ZEXT1664(local_1098);
              auVar45 = vrcpps_avx(auVar39);
              auVar65._8_4_ = 0x3f800000;
              auVar65._0_8_ = &DAT_3f8000003f800000;
              auVar65._12_4_ = 0x3f800000;
              auVar39 = vfnmadd213ps_fma(auVar39,auVar45,auVar65);
              auVar45 = vfmadd132ps_fma(auVar39,auVar45,auVar45);
              auVar39 = vrcpps_avx(auVar34);
              auVar34 = vfnmadd213ps_fma(auVar34,auVar39,auVar65);
              auVar34 = vfmadd132ps_fma(auVar34,auVar39,auVar39);
              auVar39 = vrcpps_avx(auVar35);
              auVar52 = vfnmadd213ps_fma(auVar35,auVar39,auVar65);
              auVar66 = ZEXT1664(local_1088);
              auVar35 = vfmadd213ps_fma(auVar26,auVar47,*(undefined1 (*) [16])(uVar10 + 0xb0));
              auVar26 = vfmadd132ps_fma(auVar52,auVar39,auVar39);
              auVar64 = ZEXT1664(local_1078);
              auVar35 = vfmadd231ps_fma(auVar35,local_1098,*(undefined1 (*) [16])(uVar10 + 0x50));
              auVar21 = vfmadd213ps_fma(auVar21,auVar47,*(undefined1 (*) [16])(uVar10 + 0xc0));
              auVar39 = vfmadd231ps_fma(auVar21,local_1098,*(undefined1 (*) [16])(uVar10 + 0x60));
              auVar21 = vfmadd213ps_fma(auVar49,auVar47,*(undefined1 (*) [16])(uVar10 + 0xd0));
              auVar21 = vfmadd231ps_fma(auVar21,local_1098,*(undefined1 (*) [16])(uVar10 + 0x70));
              auVar61 = ZEXT1664(local_1058);
              auVar49 = vfmadd231ps_fma(auVar35,local_1088,*(undefined1 (*) [16])(uVar10 + 0x20));
              auVar32._0_4_ = auVar49._0_4_ * -auVar45._0_4_;
              auVar32._4_4_ = auVar49._4_4_ * -auVar45._4_4_;
              auVar32._8_4_ = auVar49._8_4_ * -auVar45._8_4_;
              auVar32._12_4_ = auVar49._12_4_ * -auVar45._12_4_;
              auVar49 = vfmadd231ps_fma(auVar39,local_1088,*(undefined1 (*) [16])(uVar10 + 0x30));
              auVar29._0_4_ = auVar49._0_4_ * -auVar34._0_4_;
              auVar29._4_4_ = auVar49._4_4_ * -auVar34._4_4_;
              auVar29._8_4_ = auVar49._8_4_ * -auVar34._8_4_;
              auVar29._12_4_ = auVar49._12_4_ * -auVar34._12_4_;
              auVar57 = ZEXT1664(local_1038);
              auVar21 = vfmadd231ps_fma(auVar21,local_1088,local_1008);
              auVar23._0_4_ = auVar21._0_4_ * -auVar26._0_4_;
              auVar23._4_4_ = auVar21._4_4_ * -auVar26._4_4_;
              auVar23._8_4_ = auVar21._8_4_ * -auVar26._8_4_;
              auVar23._12_4_ = auVar21._12_4_ * -auVar26._12_4_;
              auVar38._0_4_ = auVar45._0_4_ + auVar32._0_4_;
              auVar38._4_4_ = auVar45._4_4_ + auVar32._4_4_;
              auVar38._8_4_ = auVar45._8_4_ + auVar32._8_4_;
              auVar38._12_4_ = auVar45._12_4_ + auVar32._12_4_;
              auVar43._0_4_ = auVar34._0_4_ + auVar29._0_4_;
              auVar43._4_4_ = auVar34._4_4_ + auVar29._4_4_;
              auVar43._8_4_ = auVar34._8_4_ + auVar29._8_4_;
              auVar43._12_4_ = auVar34._12_4_ + auVar29._12_4_;
              auVar48._0_4_ = auVar26._0_4_ + auVar23._0_4_;
              auVar48._4_4_ = auVar26._4_4_ + auVar23._4_4_;
              auVar48._8_4_ = auVar26._8_4_ + auVar23._8_4_;
              auVar48._12_4_ = auVar26._12_4_ + auVar23._12_4_;
              auVar63 = ZEXT1664(local_1068);
              auVar26 = vpminsd_avx(auVar29,auVar43);
              auVar21 = vpminsd_avx(auVar23,auVar48);
              auVar26 = vmaxps_avx(auVar26,auVar21);
              auVar39 = vpminsd_avx(auVar32,auVar38);
              auVar35 = vpmaxsd_avx(auVar32,auVar38);
              auVar21 = vpmaxsd_avx(auVar29,auVar43);
              auVar49 = vpmaxsd_avx(auVar23,auVar48);
              auVar49 = vminps_avx(auVar21,auVar49);
              auVar21 = vmaxps_avx(local_1078,auVar39);
              auVar56 = ZEXT1664(local_1028);
              auVar26 = vmaxps_avx(auVar21,auVar26);
              auVar51 = ZEXT1664(local_1018);
              auVar21 = vminps_avx(auVar20._0_16_,auVar35);
              auVar21 = vminps_avx(auVar21,auVar49);
              local_10c8._0_4_ = auVar26._0_4_ * 0.99999964;
              local_10c8._4_4_ = auVar26._4_4_ * 0.99999964;
              local_10c8._8_4_ = auVar26._8_4_ * 0.99999964;
              local_10c8._12_4_ = auVar26._12_4_ * 0.99999964;
              auVar24._0_4_ = auVar21._0_4_ * 1.0000004;
              auVar24._4_4_ = auVar21._4_4_ * 1.0000004;
              auVar24._8_4_ = auVar21._8_4_ * 1.0000004;
              auVar24._12_4_ = auVar21._12_4_ * 1.0000004;
              auVar26 = vcmpps_avx(local_10c8,auVar24,2);
              uVar19 = vmovmskps_avx(auVar26);
              auVar35._0_4_ = local_1048;
              fVar58 = fStack_1044;
              fVar59 = fStack_1040;
              fVar60 = fStack_103c;
              goto LAB_019d82bb;
            }
            bVar7 = false;
          }
          if (bVar7) {
            if (unaff_R15 == 0) {
              iVar9 = 4;
            }
            else {
              uVar10 = uVar11 & 0xfffffffffffffff0;
              lVar4 = 0;
              for (uVar11 = unaff_R15; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000)
              {
                lVar4 = lVar4 + 1;
              }
              iVar9 = 0;
              uVar12 = unaff_R15 - 1 & unaff_R15;
              uVar11 = *(ulong *)(uVar10 + lVar4 * 8);
              if (uVar12 != 0) {
                uVar2 = *(uint *)(local_10c8 + lVar4 * 4);
                lVar4 = 0;
                for (uVar5 = uVar12; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                  lVar4 = lVar4 + 1;
                }
                uVar12 = uVar12 - 1 & uVar12;
                uVar5 = *(ulong *)(uVar10 + lVar4 * 8);
                uVar3 = *(uint *)(local_10c8 + lVar4 * 4);
                if (uVar12 == 0) {
                  if (uVar2 < uVar3) {
                    *(ulong *)*pauVar14 = uVar5;
                    *(uint *)(*pauVar14 + 8) = uVar3;
                    pauVar14 = pauVar14 + 1;
                  }
                  else {
                    *(ulong *)*pauVar14 = uVar11;
                    *(uint *)(*pauVar14 + 8) = uVar2;
                    uVar11 = uVar5;
                    pauVar14 = pauVar14 + 1;
                  }
                }
                else {
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = uVar11;
                  auVar26 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar2));
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = uVar5;
                  auVar21 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar3));
                  lVar4 = 0;
                  for (uVar11 = uVar12; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000
                      ) {
                    lVar4 = lVar4 + 1;
                  }
                  uVar12 = uVar12 - 1 & uVar12;
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = *(ulong *)(uVar10 + lVar4 * 8);
                  auVar39 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_10c8 + lVar4 * 4)));
                  auVar49 = vpcmpgtd_avx(auVar21,auVar26);
                  if (uVar12 == 0) {
                    auVar34 = vpshufd_avx(auVar49,0xaa);
                    auVar49 = vblendvps_avx(auVar21,auVar26,auVar34);
                    auVar26 = vblendvps_avx(auVar26,auVar21,auVar34);
                    auVar21 = vpcmpgtd_avx(auVar39,auVar49);
                    auVar34 = vpshufd_avx(auVar21,0xaa);
                    auVar21 = vblendvps_avx(auVar39,auVar49,auVar34);
                    auVar49 = vblendvps_avx(auVar49,auVar39,auVar34);
                    auVar39 = vpcmpgtd_avx(auVar49,auVar26);
                    auVar34 = vpshufd_avx(auVar39,0xaa);
                    auVar39 = vblendvps_avx(auVar49,auVar26,auVar34);
                    auVar26 = vblendvps_avx(auVar26,auVar49,auVar34);
                    *pauVar14 = auVar26;
                    pauVar14[1] = auVar39;
                    uVar11 = auVar21._0_8_;
                    pauVar14 = pauVar14 + 2;
                  }
                  else {
                    lVar4 = 0;
                    for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                      lVar4 = lVar4 + 1;
                    }
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = *(ulong *)(uVar10 + lVar4 * 8);
                    auVar45 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_10c8 + lVar4 * 4)));
                    auVar34 = vpshufd_avx(auVar49,0xaa);
                    auVar49 = vblendvps_avx(auVar21,auVar26,auVar34);
                    auVar26 = vblendvps_avx(auVar26,auVar21,auVar34);
                    auVar21 = vpcmpgtd_avx(auVar45,auVar39);
                    auVar34 = vpshufd_avx(auVar21,0xaa);
                    auVar21 = vblendvps_avx(auVar45,auVar39,auVar34);
                    auVar39 = vblendvps_avx(auVar39,auVar45,auVar34);
                    auVar34 = vpcmpgtd_avx(auVar39,auVar26);
                    auVar45 = vpshufd_avx(auVar34,0xaa);
                    auVar34 = vblendvps_avx(auVar39,auVar26,auVar45);
                    auVar26 = vblendvps_avx(auVar26,auVar39,auVar45);
                    auVar39 = vpcmpgtd_avx(auVar21,auVar49);
                    auVar45 = vpshufd_avx(auVar39,0xaa);
                    auVar39 = vblendvps_avx(auVar21,auVar49,auVar45);
                    auVar21 = vblendvps_avx(auVar49,auVar21,auVar45);
                    auVar49 = vpcmpgtd_avx(auVar34,auVar21);
                    auVar45 = vpshufd_avx(auVar49,0xaa);
                    auVar49 = vblendvps_avx(auVar34,auVar21,auVar45);
                    auVar21 = vblendvps_avx(auVar21,auVar34,auVar45);
                    *pauVar14 = auVar26;
                    pauVar14[1] = auVar21;
                    pauVar14[2] = auVar49;
                    uVar11 = auVar39._0_8_;
                    pauVar14 = pauVar14 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar9 = 6;
          }
        } while (iVar9 == 0);
        if (iVar9 == 6) {
          (**(code **)((long)local_10a8->leafIntersector +
                      (ulong)*(byte *)(uVar11 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_10a0);
          auVar68 = ZEXT1664(local_1098);
          auVar66 = ZEXT1664(local_1088);
          auVar64 = ZEXT1664(local_1078);
          auVar63 = ZEXT1664(local_1068);
          auVar61 = ZEXT1664(local_1058);
          auVar57 = ZEXT1664(local_1038);
          auVar56 = ZEXT1664(local_1028);
          auVar51 = ZEXT1664(local_1018);
          auVar35._0_4_ = (ray->super_RayK<1>).tfar;
          auVar20 = ZEXT1664(CONCAT412(auVar35._0_4_,
                                       CONCAT48(auVar35._0_4_,CONCAT44(auVar35._0_4_,auVar35._0_4_))
                                      ));
          uVar16 = local_10b8;
          uVar18 = local_10b0;
          auVar35._0_4_ = local_1048;
          fVar58 = fStack_1044;
          fVar59 = fStack_1040;
          fVar60 = fStack_103c;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }